

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

bool __thiscall
JsUtil::
BaseDictionary<Js::NumberPair,_Js::NumberPair,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
::ContainsKey(BaseDictionary<Js::NumberPair,_Js::NumberPair,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
              *this,NumberPair *key)

{
  Type piVar1;
  NumberPair NVar2;
  hash_t hVar3;
  uint depth;
  Type this_00;
  uint uVar4;
  
  piVar1 = this->buckets;
  depth = 0;
  if (piVar1 != (Type)0x0) {
    hVar3 = PrimePolicy::ModPrime
                      (key->x * 0x10000 + key->y & 0x7fffffff,this->bucketCount,
                       this->modFunctionIndex);
    uVar4 = piVar1[hVar3];
    depth = 0;
    if (-1 < (int)uVar4) {
      depth = 0;
      do {
        NVar2 = this->entries[uVar4].
                super_DefaultHashedEntry<Js::NumberPair,_Js::NumberPair,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                .super_ImplicitKeyValueEntry<Js::NumberPair,_Js::NumberPair>.
                super_ValueEntry<Js::NumberPair,_JsUtil::(anonymous_namespace)::ValueEntryData<Js::NumberPair>_>
                .super_ValueEntryData<Js::NumberPair>.value;
        if ((key->x == NVar2.x) && (key->y == NVar2.y)) {
          this_00 = this->stats;
          goto LAB_001f37f5;
        }
        depth = depth + 1;
        uVar4 = this->entries[uVar4].
                super_DefaultHashedEntry<Js::NumberPair,_Js::NumberPair,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                .super_ImplicitKeyValueEntry<Js::NumberPair,_Js::NumberPair>.
                super_ValueEntry<Js::NumberPair,_JsUtil::(anonymous_namespace)::ValueEntryData<Js::NumberPair>_>
                .super_ValueEntryData<Js::NumberPair>.next;
      } while (-1 < (int)uVar4);
    }
  }
  this_00 = this->stats;
  uVar4 = 0xffffffff;
LAB_001f37f5:
  if (this_00 != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this_00,depth);
  }
  return -1 < (int)uVar4;
}

Assistant:

bool ContainsKey(const TKey& key) const
        {
            return FindEntry(key) >= 0;
        }